

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Unique<vk::Handle<(vk::HandleType)16>_> obj;
  Resources res;
  Environment env;
  VkPipelineLayout local_c8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_c0;
  Resources local_a8;
  Move<vk::Handle<(vk::HandleType)16>_> local_78;
  Environment local_58;
  
  local_58.vkp = context->m_platformInterface;
  local_58.vkd = Context::getDeviceInterface(context);
  local_58.device = Context::getDevice(context);
  local_58.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_58.programBinaries = context->m_progCollection;
  local_58.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_58.maxResourceConsumers = 1;
  PipelineLayout::Resources::Resources(&local_a8,&local_58,params);
  PipelineLayout::create
            (&local_78,&local_58,
             (Resources *)
             local_a8.pSetLayouts.
             super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (Parameters *)
             local_a8.pSetLayouts.
             super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  DStack_c0.m_device =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  DStack_c0.m_allocator =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_c8.m_internal._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal._4_4_;
  local_c8.m_internal._0_4_ =
       (undefined4)local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  DStack_c0.m_deviceIface._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_c0.m_deviceIface._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface._4_4_;
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_c0,local_c8);
  }
  local_c8.m_internal = (deUint64)&DStack_c0.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_c8.m_internal,
             (undefined1 *)
             (CONCAT44(DStack_c0.m_deviceIface._4_4_,DStack_c0.m_deviceIface._0_4_) +
             local_c8.m_internal));
  if ((VkDevice *)local_c8.m_internal != &DStack_c0.m_device) {
    operator_delete((void *)local_c8.m_internal,(ulong)(DStack_c0.m_device + 1));
  }
  if ((Resources *)
      local_a8.pSetLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Resources *)0x0) {
    operator_delete(local_a8.pSetLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ::~vector(&local_a8.descriptorSetLayouts);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}